

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O0

MPP_RET mpi_enc_test_cmd_update_by_args(MpiEncTestArgs *cmd,int argc,char **argv)

{
  RK_S32 RVar1;
  uint local_30;
  MPP_RET local_2c;
  RK_U32 i;
  RK_S32 ret;
  MppOpt opts;
  char **argv_local;
  MpiEncTestArgs *pMStack_10;
  int argc_local;
  MpiEncTestArgs *cmd_local;
  
  _i = (MppOpt)0x0;
  local_2c = MPP_NOK;
  opts = argv;
  argv_local._4_4_ = argc;
  pMStack_10 = cmd;
  if (((1 < argc) && (cmd != (MpiEncTestArgs *)0x0)) && (argv != (char **)0x0)) {
    cmd->rc_mode = 5;
    mpp_opt_init((MppOpt *)&i);
    mpp_opt_setup(_i,pMStack_10);
    for (local_30 = 0; local_30 < enc_opt_cnt; local_30 = local_30 + 1) {
      mpp_opt_add(_i,enc_opts + local_30);
    }
    mpp_opt_add(_i,(MppOptInfo *)0x0);
    local_2c = mpp_opt_parse(_i,argv_local._4_4_,(char **)opts);
    if (pMStack_10->type < MPP_VIDEO_CodingMPEG2) {
      _mpp_log_l(2,"mpi_enc_utils","invalid type %d\n",0,pMStack_10->type);
      local_2c = MPP_NOK;
    }
    if (pMStack_10->rc_mode == 5) {
      RVar1 = 0;
      if (pMStack_10->type == MPP_VIDEO_CodingMJPEG) {
        RVar1 = 2;
      }
      pMStack_10->rc_mode = RVar1;
    }
    if (pMStack_10->hor_stride == 0) {
      RVar1 = mpi_enc_width_default_stride(pMStack_10->width,pMStack_10->format);
      pMStack_10->hor_stride = RVar1;
    }
    if (pMStack_10->ver_stride == 0) {
      pMStack_10->ver_stride = pMStack_10->height + 1U & 0xfffffffe;
    }
    if ((pMStack_10->type_src == MPP_VIDEO_CodingUnused) &&
       (((pMStack_10->width < 1 || (pMStack_10->height < 1)) ||
        ((pMStack_10->hor_stride < 1 || (pMStack_10->ver_stride < 1)))))) {
      _mpp_log_l(2,"mpi_enc_utils","invalid w:h [%d:%d] stride [%d:%d]\n",0,pMStack_10->width,
                 pMStack_10->height,pMStack_10->hor_stride,pMStack_10->ver_stride);
      local_2c = MPP_NOK;
    }
    if (((pMStack_10->rc_mode == 2) && (pMStack_10->qp_init == 0)) &&
       ((pMStack_10->type == MPP_VIDEO_CodingAVC || (pMStack_10->type == MPP_VIDEO_CodingHEVC)))) {
      pMStack_10->qp_init = 0x1a;
    }
    if (pMStack_10->trace_fps != 0) {
      fps_calc_init(&pMStack_10->fps);
      if ((pMStack_10->fps == (FpsCalc)0x0) &&
         (_mpp_log_l(2,"mpi_enc_utils","Assertion %s failed at %s:%d\n",0,"cmd->fps",
                     "mpi_enc_test_cmd_update_by_args",0x370), (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      fps_calc_set_cb(pMStack_10->fps,show_enc_fps);
    }
  }
  if (_i != (MppOpt)0x0) {
    mpp_opt_deinit(_i);
    _i = (MppOpt)0x0;
  }
  if (local_2c != MPP_OK) {
    mpi_enc_show_help(*opts);
  }
  return local_2c;
}

Assistant:

MPP_RET mpi_enc_test_cmd_update_by_args(MpiEncTestArgs* cmd, int argc, char **argv)
{
    MppOpt opts = NULL;
    RK_S32 ret = -1;
    RK_U32 i;

    if ((argc < 2) || NULL == cmd || NULL == argv)
        goto done;

    cmd->rc_mode = MPP_ENC_RC_MODE_BUTT;

    mpp_opt_init(&opts);
    /* should change node count when option increases */
    mpp_opt_setup(opts, cmd);

    for (i = 0; i < enc_opt_cnt; i++)
        mpp_opt_add(opts, &enc_opts[i]);

    /* mark option end */
    mpp_opt_add(opts, NULL);
    ret = mpp_opt_parse(opts, argc, argv);
    /* check essential parameter */
    if (cmd->type <= MPP_VIDEO_CodingAutoDetect) {
        mpp_err("invalid type %d\n", cmd->type);
        ret = MPP_NOK;
    }

    if (cmd->rc_mode == MPP_ENC_RC_MODE_BUTT)
        cmd->rc_mode = (cmd->type == MPP_VIDEO_CodingMJPEG) ?
                       MPP_ENC_RC_MODE_FIXQP : MPP_ENC_RC_MODE_VBR;

    if (!cmd->hor_stride)
        cmd->hor_stride = mpi_enc_width_default_stride(cmd->width, cmd->format);
    if (!cmd->ver_stride)
        cmd->ver_stride = MPP_ALIGN(cmd->height, 2);

    if (cmd->type_src == MPP_VIDEO_CodingUnused) {
        if (cmd->width <= 0 || cmd->height <= 0 ||
            cmd->hor_stride <= 0 || cmd->ver_stride <= 0) {
            mpp_err("invalid w:h [%d:%d] stride [%d:%d]\n",
                    cmd->width, cmd->height, cmd->hor_stride, cmd->ver_stride);
            ret = MPP_NOK;
        }
    }

    if (cmd->rc_mode == MPP_ENC_RC_MODE_FIXQP) {
        if (!cmd->qp_init) {
            if (cmd->type == MPP_VIDEO_CodingAVC ||
                cmd->type == MPP_VIDEO_CodingHEVC)
                cmd->qp_init = 26;
        }
    }

    if (cmd->trace_fps) {
        fps_calc_init(&cmd->fps);
        mpp_assert(cmd->fps);
        fps_calc_set_cb(cmd->fps, show_enc_fps);
    }

done:
    if (opts) {
        mpp_opt_deinit(opts);
        opts = NULL;
    }
    if (ret)
        mpi_enc_show_help(argv[0]);

    return ret;
}